

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InlineCache.cpp
# Opt level: O0

bool __thiscall
Js::InlineCache::HasDifferentType<false>
          (InlineCache *this,bool isProto,Type *type,Type *typeWithoutProperty)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  bool local_3b;
  bool local_3a;
  bool local_39;
  Type *typeWithoutProperty_local;
  Type *type_local;
  bool isProto_local;
  InlineCache *this_local;
  
  if ((isProto) && (typeWithoutProperty != (Type *)0x0)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InlineCache.cpp"
                                ,0x201,"(!isAccessor && !isProto || !typeWithoutProperty)",
                                "!isAccessor && !isProto || !typeWithoutProperty");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  if (isProto) {
    bVar2 = IsEmpty(this);
    local_39 = false;
    if ((!bVar2) && (local_39 = false, (this->u).local.typeWithoutProperty != type)) {
      local_39 = (this->u).local.typeWithoutProperty != (Type *)((ulong)type | 4);
    }
    this_local._7_1_ = local_39;
  }
  else {
    if ((((this->u).local.typeWithoutProperty != (Type *)0x0) &&
        (typeWithoutProperty != (Type *)0x0)) &&
       ((((this->u).local.type == type &&
         ((this->u).local.typeWithoutProperty != typeWithoutProperty)) ||
        (((this->u).local.type == (Type *)((ulong)type | 4) &&
         ((this->u).local.typeWithoutProperty != (Type *)((ulong)typeWithoutProperty | 4))))))) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InlineCache.cpp"
                                  ,0x20f,
                                  "((u.local.typeWithoutProperty == nullptr || typeWithoutProperty == nullptr) || ((u.local.type != type || u.local.typeWithoutProperty == typeWithoutProperty) && (u.local.type != (reinterpret_cast<Type*>(reinterpret_cast<size_t>(type) | 4)) || u.local.typeWithoutProperty == (reinterpret_cast<Type*>(reinterpret_cast<size_t>(typeWithoutProperty) | 4)))))"
                                  ,
                                  "(u.local.typeWithoutProperty == nullptr || typeWithoutProperty == nullptr) || ((u.local.type != type || u.local.typeWithoutProperty == typeWithoutProperty) && (u.local.type != TypeWithAuxSlotTag(type) || u.local.typeWithoutProperty == TypeWithAuxSlotTag(typeWithoutProperty)))"
                                 );
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 0;
    }
    bVar2 = IsEmpty(this);
    local_3a = false;
    if (!bVar2) {
      local_3b = false;
      if ((this->u).local.type != type) {
        local_3b = (this->u).local.type != (Type *)((ulong)type | 4);
      }
      local_3a = local_3b;
    }
    this_local._7_1_ = local_3a;
  }
  return this_local._7_1_;
}

Assistant:

bool InlineCache::HasDifferentType(const bool isProto, const Type * type, const Type * typeWithoutProperty) const
    {
        Assert(!isAccessor && !isProto || !typeWithoutProperty);

        if (isAccessor)
        {
            return !IsEmpty() && u.accessor.type != type && u.accessor.type != TypeWithAuxSlotTag(type);
        }
        if (isProto)
        {
            return !IsEmpty() && u.proto.type != type && u.proto.type != TypeWithAuxSlotTag(type);
        }

        // If the new type matches the cached type, the types without property must also match (unless one of them is null).
        Assert((u.local.typeWithoutProperty == nullptr || typeWithoutProperty == nullptr) ||
            ((u.local.type != type || u.local.typeWithoutProperty == typeWithoutProperty) &&
                (u.local.type != TypeWithAuxSlotTag(type) || u.local.typeWithoutProperty == TypeWithAuxSlotTag(typeWithoutProperty))));

        // Don't consider a cache polymorphic, if it differs only by the typeWithoutProperty.  We can handle this case with
        // the monomorphic cache.
        return !IsEmpty() && (u.local.type != type && u.local.type != TypeWithAuxSlotTag(type));
    }